

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.hpp
# Opt level: O1

void __thiscall antlr::RecognitionException::~RecognitionException(RecognitionException *this)

{
  ~RecognitionException(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~RecognitionException() throw()
		{
		}